

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::fixOffset(TParseContext *this,TSourceLoc *loc,TSymbol *symbol)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  uint *puVar8;
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TArraySizes *this_00;
  undefined4 extraout_var_05;
  
  iVar4 = (*symbol->_vptr_TSymbol[0xc])(symbol);
  lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*symbol->_vptr_TSymbol[0xc])(symbol);
  if (*(char *)(CONCAT44(extraout_var_00,iVar4) + 8) != '\r') {
    return;
  }
  if ((short)((ulong)*(undefined8 *)(lVar7 + 0x1c) >> 0x20) == -1) {
    return;
  }
  uVar1 = (uint)((ulong)*(undefined8 *)(lVar7 + 0x1c) >> 0x20);
  if ((this->resources).maxAtomicCounterBindings <= (int)(uVar1 & 0xffff)) {
    return;
  }
  puVar8 = (uint *)((ulong)((uVar1 & 0xffff) << 2) + (long)this->atomicUintOffsets);
  if (*(int *)(lVar7 + 0x14) != -1) {
    puVar8 = (uint *)(lVar7 + 0x14);
  }
  uVar1 = *puVar8;
  if ((uVar1 & 3) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"atomic counters offset should align based on 4:","offset","%d",(ulong)uVar1
              );
  }
  iVar4 = (*symbol->_vptr_TSymbol[0xd])(symbol);
  lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x50))
                    ((long *)CONCAT44(extraout_var_01,iVar4));
  *(uint *)(lVar9 + 0x14) = uVar1;
  iVar4 = (*symbol->_vptr_TSymbol[0xc])(symbol);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0xe8))
                    ((long *)CONCAT44(extraout_var_02,iVar4));
  iVar4 = 4;
  if (cVar2 != '\0') {
    iVar5 = (*symbol->_vptr_TSymbol[0xc])(symbol);
    cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xf0))
                      ((long *)CONCAT44(extraout_var_03,iVar5));
    if (cVar2 != '\0') {
      iVar5 = (*symbol->_vptr_TSymbol[0xc])(symbol);
      this_00 = (TArraySizes *)
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x98))
                          ((long *)CONCAT44(extraout_var_04,iVar5));
      bVar3 = TArraySizes::isInnerUnsized(this_00);
      if (!bVar3) {
        iVar4 = (*symbol->_vptr_TSymbol[0xc])(symbol);
        iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x88))
                          ((long *)CONCAT44(extraout_var_05,iVar4));
        iVar4 = iVar4 << 2;
        goto LAB_0042e862;
      }
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"array must be explicitly sized","atomic_uint","");
  }
LAB_0042e862:
  uVar6 = TIntermediate::addUsedOffsets
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     (uint)*(ushort *)(lVar7 + 0x20),uVar1,iVar4);
  if (-1 < (int)uVar6) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"atomic counters sharing the same offset:","offset","%d",(ulong)uVar6);
  }
  this->atomicUintOffsets[*(ushort *)(lVar7 + 0x20)] = iVar4 + uVar1;
  return;
}

Assistant:

void TParseContext::fixOffset(const TSourceLoc& loc, TSymbol& symbol)
{
    const TQualifier& qualifier = symbol.getType().getQualifier();
    if (symbol.getType().isAtomic()) {
        if (qualifier.hasBinding() && (int)qualifier.layoutBinding < resources.maxAtomicCounterBindings) {

            // Set the offset
            int offset;
            if (qualifier.hasOffset())
                offset = qualifier.layoutOffset;
            else
                offset = atomicUintOffsets[qualifier.layoutBinding];

            if (offset % 4 != 0)
                error(loc, "atomic counters offset should align based on 4:", "offset", "%d", offset);

            symbol.getWritableType().getQualifier().layoutOffset = offset;

            // Check for overlap
            int numOffsets = 4;
            if (symbol.getType().isArray()) {
                if (symbol.getType().isSizedArray() && !symbol.getType().getArraySizes()->isInnerUnsized())
                    numOffsets *= symbol.getType().getCumulativeArraySize();
                else {
                    // "It is a compile-time error to declare an unsized array of atomic_uint."
                    error(loc, "array must be explicitly sized", "atomic_uint", "");
                }
            }
            int repeated = intermediate.addUsedOffsets(qualifier.layoutBinding, offset, numOffsets);
            if (repeated >= 0)
                error(loc, "atomic counters sharing the same offset:", "offset", "%d", repeated);

            // Bump the default offset
            atomicUintOffsets[qualifier.layoutBinding] = offset + numOffsets;
        }
    }
}